

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void enter_room(tgestate_t *state)

{
  tgestate_t *in_RDI;
  uint8_t in_stack_0000000f;
  tgestate_t *in_stack_00000010;
  tgestate_t *in_stack_00000020;
  
  (in_RDI->game_window_offset).x = '\0';
  (in_RDI->game_window_offset).y = '\0';
  setup_room(in_stack_00000020);
  plot_interior_tiles(in_RDI);
  (in_RDI->map_position).x = 't';
  (in_RDI->map_position).y = 0xea;
  set_hero_sprite_for_room(in_RDI);
  calc_vischar_isopos_from_vischar(state,(vischar_t *)in_RDI);
  setup_movable_items(state);
  zoombox(in_stack_00000010);
  increase_score(in_stack_00000010,in_stack_0000000f);
  squash_stack_goto_main((tgestate_t *)0x1065b9);
  return;
}

Assistant:

void enter_room(tgestate_t *state)
{
  assert(state != NULL);

  state->game_window_offset.x = 0;
  state->game_window_offset.y = 0;
  // FUTURE: replace with call to setup_room_and_plot
  setup_room(state);
  plot_interior_tiles(state);
  state->map_position.x = 116;
  state->map_position.y = 234;
  set_hero_sprite_for_room(state);
  calc_vischar_isopos_from_vischar(state, &state->vischars[0]);
  setup_movable_items(state);
  zoombox(state);
  increase_score(state, 1);

  squash_stack_goto_main(state); /* was fallthrough */
  NEVER_RETURNS;
}